

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelinePostFS::Cleanup(AdvancedPipelinePostFS *this)

{
  CallLogWrapper *this_00;
  RenderTarget *pRVar1;
  int i;
  long lVar2;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  pRVar1 = (this->super_ComputeShaderBase).renderTarget;
  lVar2 = 0;
  glu::CallLogWrapper::glViewport(this_00,0,0,pRVar1->m_width,pRVar1->m_height);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  do {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  glu::CallLogWrapper::glDeleteTextures(this_00,2,this->m_render_target);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&this->m_framebuffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glUseProgram(0);
		for (int i = 0; i < 3; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteTextures(2, m_render_target);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteFramebuffers(1, &m_framebuffer);
		return NO_ERROR;
	}